

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O0

Vec_Int_t * Llb_ManDeriveConstraints(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *local_28;
  Vec_Int_t *vNodes;
  DdManager *dd;
  Aig_Man_t *p_local;
  
  dd = (DdManager *)p;
  iVar1 = Saig_ManPoNum(p);
  if (iVar1 == 1) {
    iVar1 = Saig_ManPoNum((Aig_Man_t *)dd);
    if (iVar1 != 1) {
      __assert_fail("Saig_ManPoNum(p) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Constr.c"
                    ,0x114,"Vec_Int_t *Llb_ManDeriveConstraints(Aig_Man_t *)");
    }
    vNodes = (Vec_Int_t *)Llb_ManConstructGlobalBdds((Aig_Man_t *)dd);
    local_28 = (Aig_Man_t *)Llb_ManComputeBaseCase((Aig_Man_t *)dd,(DdManager *)vNodes);
    iVar1 = Llb_ManCountEntries((Vec_Int_t *)local_28);
    if (0 < iVar1) {
      Llb_ManComputeIndCase((Aig_Man_t *)dd,(DdManager *)vNodes,(Vec_Int_t *)local_28);
    }
    iVar1 = Llb_ManCountEntries((Vec_Int_t *)local_28);
    if (iVar1 == 0) {
      Vec_IntFreeP((Vec_Int_t **)&local_28);
    }
    Llb_ManDerefenceBdds((Aig_Man_t *)dd,(DdManager *)vNodes);
    Extra_StopManager((DdManager *)vNodes);
    p_local = local_28;
  }
  else {
    uVar2 = Saig_ManPoNum((Aig_Man_t *)dd);
    printf("The AIG has %d property outputs.\n",(ulong)uVar2);
    p_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Llb_ManDeriveConstraints( Aig_Man_t * p )
{
    DdManager * dd;
    Vec_Int_t * vNodes;
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The AIG has %d property outputs.\n", Saig_ManPoNum(p) );
        return NULL;
    }
    assert( Saig_ManPoNum(p) == 1 );
    dd = Llb_ManConstructGlobalBdds( p );
    vNodes = Llb_ManComputeBaseCase( p, dd );
    if ( Llb_ManCountEntries(vNodes) > 0 )
        Llb_ManComputeIndCase( p, dd, vNodes );
    if ( Llb_ManCountEntries(vNodes) == 0 )
        Vec_IntFreeP( &vNodes );
    Llb_ManDerefenceBdds( p, dd );
    Extra_StopManager( dd );
    return vNodes;
}